

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

dictionary_t dictionary_text_open(char *filename)

{
  int iVar1;
  void *pvVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  size_t length;
  size_t i;
  FILE *fp;
  text_dictionary_desc *text_dictionary;
  char *filename_local;
  
  filename_local = (char *)malloc(0x20);
  *(ulong *)filename_local = 0x400;
  *(ulong *)((long)filename_local + 8) = 0;
  pvVar2 = malloc(*(ulong *)filename_local << 4);
  *(void **)((long)filename_local + 0x10) = pvVar2;
  *(ulong *)((long)filename_local + 0x18) = 0;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    dictionary_text_close(filename_local);
    filename_local = (char *)0xffffffffffffffff;
  }
  else {
    length = 0;
    while (pcVar3 = fgets(dictionary_text_open::buff,0x80,__stream), pcVar3 != (char *)0x0) {
      if (*(ulong *)filename_local <= length) {
        *(ulong *)filename_local = *(ulong *)filename_local + *(ulong *)filename_local;
        pvVar2 = realloc(*(void **)((long)filename_local + 0x10),*(ulong *)filename_local << 4);
        *(void **)((long)filename_local + 0x10) = pvVar2;
      }
      iVar1 = parse_entry(dictionary_text_open::buff,
                          (entry *)(*(ulong *)((long)filename_local + 0x10) + length * 0x10));
      if (iVar1 == -1) {
        *(size_t *)filename_local = length;
        dictionary_text_close(filename_local);
        return (dictionary_t)0xffffffffffffffff;
      }
      sVar4 = ucs4len(*(ucs4_t **)(*(ulong *)((long)filename_local + 0x10) + length * 0x10));
      if (*(ulong *)((long)filename_local + 8) < sVar4) {
        *(size_t *)((long)filename_local + 8) = sVar4;
      }
      length = length + 1;
    }
    fclose(__stream);
    *(size_t *)filename_local = length;
    pvVar2 = realloc(*(void **)((long)filename_local + 0x10),*(ulong *)filename_local << 4);
    *(void **)((long)filename_local + 0x10) = pvVar2;
    pvVar2 = malloc((*(ulong *)((long)filename_local + 8) + 1) * 4);
    *(void **)((long)filename_local + 0x18) = pvVar2;
    qsort(*(void **)((long)filename_local + 0x10),*(size_t *)filename_local,0x10,qsort_entry_cmp);
  }
  return filename_local;
}

Assistant:

dictionary_t dictionary_text_open(const char * filename)
{
	text_dictionary_desc * text_dictionary;
	text_dictionary = (text_dictionary_desc *) malloc(sizeof(text_dictionary_desc));
	text_dictionary->entry_count = INITIAL_DICTIONARY_SIZE;
	text_dictionary->max_length = 0;
	text_dictionary->lexicon = (entry *) malloc(sizeof(entry) * text_dictionary->entry_count);
	text_dictionary->word_buff = NULL;

	static char buff[ENTRY_BUFF_SIZE];

	FILE * fp = fopen(filename,"rb");
	if (fp == NULL)
	{
		dictionary_text_close((dictionary_t) text_dictionary);
		return (dictionary_t) -1;
	}

	size_t i = 0;
	while (fgets(buff, ENTRY_BUFF_SIZE, fp))
	{
		if (i >= text_dictionary->entry_count)
		{
			text_dictionary->entry_count += text_dictionary->entry_count;
			text_dictionary->lexicon = (entry *) realloc(
				text_dictionary->lexicon,
				sizeof(entry) * text_dictionary->entry_count
			);
		}

		if (parse_entry(buff, text_dictionary->lexicon + i) == -1)
		{
			text_dictionary->entry_count = i;
			dictionary_text_close((dictionary_t) text_dictionary);
			return (dictionary_t) -1;
		}

		size_t length = ucs4len(text_dictionary->lexicon[i].key);
		if (length > text_dictionary->max_length)
			text_dictionary->max_length = length;

		i ++;
	}

	fclose(fp);

	text_dictionary->entry_count = i;
	text_dictionary->lexicon = (entry *) realloc(
		text_dictionary->lexicon,
		sizeof(entry) * text_dictionary->entry_count
	);
	text_dictionary->word_buff = (ucs4_t *)
		malloc(sizeof(ucs4_t) * (text_dictionary->max_length + 1));

	qsort(text_dictionary->lexicon,
		text_dictionary->entry_count,
		sizeof(text_dictionary->lexicon[0]),
		qsort_entry_cmp
	);

	return (dictionary_t) text_dictionary;
}